

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEdit::setFontFamily(QTextEdit *this,QString *fontFamily)

{
  initializer_list<QString> args;
  iterator in_RDI;
  long in_FS_OFFSET;
  QTextCharFormat fmt;
  QString *in_stack_ffffffffffffff68;
  QStringList *in_stack_ffffffffffffff70;
  QList<QString> *in_stack_ffffffffffffff78;
  size_type in_stack_ffffffffffffff88;
  long *plVar1;
  long *local_70;
  undefined1 local_30 [16];
  long local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_30);
  QString::QString((QString *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  args._M_len = in_stack_ffffffffffffff88;
  args._M_array = in_RDI;
  QList<QString>::QList(in_stack_ffffffffffffff78,args);
  QTextCharFormat::setFontFamilies
            ((QTextCharFormat *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  QList<QString>::~QList((QList<QString> *)0x6d1f21);
  plVar1 = local_20;
  local_70 = &local_8;
  do {
    local_70 = local_70 + -3;
    QString::~QString((QString *)0x6d1f47);
  } while (local_70 != plVar1);
  mergeCurrentCharFormat((QTextEdit *)local_30,(QTextCharFormat *)in_stack_ffffffffffffff68);
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x6d1f79);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::setFontFamily(const QString &fontFamily)
{
    QTextCharFormat fmt;
    fmt.setFontFamilies({fontFamily});
    mergeCurrentCharFormat(fmt);
}